

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_cParam_clampBounds(ZSTD_cParameter cParam,int *value)

{
  uint uVar1;
  ZSTD_bounds ZVar2;
  undefined8 local_30;
  ZSTD_bounds bounds;
  int *value_local;
  size_t sStack_10;
  ZSTD_cParameter cParam_local;
  
  ZVar2 = ZSTD_cParam_getBounds(cParam);
  local_30 = ZVar2.error;
  uVar1 = ZSTD_isError(local_30);
  if (uVar1 == 0) {
    bounds.error._0_4_ = ZVar2.lowerBound;
    if (*value < (int)bounds.error) {
      *value = (int)bounds.error;
    }
    bounds.error._4_4_ = ZVar2.upperBound;
    if (bounds.error._4_4_ < *value) {
      *value = bounds.error._4_4_;
    }
    sStack_10 = 0;
  }
  else {
    sStack_10 = local_30;
  }
  return sStack_10;
}

Assistant:

static size_t ZSTD_cParam_clampBounds(ZSTD_cParameter cParam, int* value)
{
    ZSTD_bounds const bounds = ZSTD_cParam_getBounds(cParam);
    if (ZSTD_isError(bounds.error)) return bounds.error;
    if (*value < bounds.lowerBound) *value = bounds.lowerBound;
    if (*value > bounds.upperBound) *value = bounds.upperBound;
    return 0;
}